

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O2

void __thiscall
NavierStokesBase::mac_project
          (NavierStokesBase *this,Real time,Real dt,MultiFab *S_old,MultiFab *divu,int ngrow,
          bool increment_vel_register)

{
  ostream *poVar1;
  Print *pPVar2;
  double dVar3;
  double dVar4;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> density_math_bc;
  Print local_1b8;
  
  if (verbose != 0) {
    poVar1 = amrex::OutStream();
    amrex::Print::Print(&local_1b8,poVar1);
    std::operator<<((ostream *)&local_1b8.ss,"... mac_projection\n");
    amrex::Print::~Print(&local_1b8);
    if ((verbose != 0) && ((anonymous_namespace)::benchmarking == '\x01')) {
      amrex::ParallelDescriptor::Barrier((string *)amrex::ParallelDescriptor::Unnamed_abi_cxx11_);
    }
  }
  dVar3 = amrex::ParallelDescriptor::second();
  fetchBCArray(&density_math_bc,this,0,3,1);
  MacProj::mac_project
            (mac_projector,(this->super_AmrLevel).level,this->u_mac,S_old,dt,time,divu,have_divu,
             density_math_bc.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
             super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
             super__Vector_impl_data._M_start,increment_vel_register);
  create_umac_grown(this,ngrow,divu);
  if (verbose != 0) {
    dVar4 = amrex::ParallelDescriptor::second();
    poVar1 = amrex::OutStream();
    amrex::Print::Print(&local_1b8,poVar1);
    std::operator<<((ostream *)&local_1b8.ss,"NavierStokesBase:mac_project(): lev: ");
    pPVar2 = amrex::Print::operator<<(&local_1b8,&(this->super_AmrLevel).level);
    std::operator<<((ostream *)&pPVar2->ss,", time: ");
    std::ostream::_M_insert<double>(dVar4 - dVar3);
    std::operator<<((ostream *)&pPVar2->ss,'\n');
    amrex::Print::~Print(&local_1b8);
  }
  std::_Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>::~_Vector_base
            ((_Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)&density_math_bc);
  return;
}

Assistant:

void
NavierStokesBase::mac_project (Real      time,
                               Real      dt,
                               MultiFab& S_old,
                               MultiFab* divu,
                               int       ngrow,
                               bool      increment_vel_register)
{
    BL_PROFILE_REGION_START("R::NavierStokesBase::mac_project()");
    BL_PROFILE("NavierStokesBase::mac_project()");

    if (verbose) {
        amrex::Print() << "... mac_projection\n";
    }

    if (verbose && benchmarking) {
        ParallelDescriptor::Barrier();
    }

    const Real strt_time = ParallelDescriptor::second();

    Vector<BCRec> density_math_bc = fetchBCArray(State_Type,Density,1);

    mac_projector->mac_project(level,u_mac,S_old,dt,time,*divu,have_divu,
                               density_math_bc[0], increment_vel_register);

    create_umac_grown(ngrow, divu);

    if (verbose)
    {
        Real run_time    = ParallelDescriptor::second() - strt_time;
        const int IOProc = ParallelDescriptor::IOProcessorNumber();

        ParallelDescriptor::ReduceRealMax(run_time,IOProc);

        amrex::Print() << "NavierStokesBase:mac_project(): lev: "
                       << level
                       << ", time: " << run_time << '\n';
    }
    BL_PROFILE_REGION_STOP("R::NavierStokesBase::mac_project()");
}